

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniversalConstraint.cpp
# Opt level: O2

void __thiscall
btUniversalConstraint::btUniversalConstraint
          (btUniversalConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *anchor,
          btVector3 *axis1,btVector3 *axis2)

{
  undefined8 uVar1;
  btTranslationalLimitMotor *pbVar2;
  btTransform *frameInA;
  btTransform *frameInB;
  btVector3 *pbVar3;
  btVector3 bVar4;
  btTransform local_118;
  btVector3 yAxis;
  btVector3 zAxis;
  btTransform local_b0;
  btTransform local_70;
  
  frameInA = btTransform::getIdentity();
  frameInB = btTransform::getIdentity();
  btGeneric6DofConstraint::btGeneric6DofConstraint
            (&this->super_btGeneric6DofConstraint,rbA,rbB,frameInA,frameInB,true);
  (this->super_btGeneric6DofConstraint).super_btTypedConstraint._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1738;
  uVar1 = *(undefined8 *)(anchor->m_floats + 2);
  *(undefined8 *)(this->m_anchor).m_floats = *(undefined8 *)anchor->m_floats;
  *(undefined8 *)((this->m_anchor).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(axis1->m_floats + 2);
  *(undefined8 *)(this->m_axis1).m_floats = *(undefined8 *)axis1->m_floats;
  *(undefined8 *)((this->m_axis1).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(axis2->m_floats + 2);
  *(undefined8 *)(this->m_axis2).m_floats = *(undefined8 *)axis2->m_floats;
  *(undefined8 *)((this->m_axis2).m_floats + 2) = uVar1;
  pbVar3 = btVector3::normalize(&this->m_axis1);
  zAxis.m_floats._0_8_ = *(undefined8 *)pbVar3->m_floats;
  zAxis.m_floats._8_8_ = *(undefined8 *)(pbVar3->m_floats + 2);
  pbVar3 = btVector3::normalize(&this->m_axis2);
  yAxis.m_floats._0_8_ = *(undefined8 *)pbVar3->m_floats;
  yAxis.m_floats._8_8_ = *(undefined8 *)(pbVar3->m_floats + 2);
  bVar4 = btVector3::cross(&yAxis,&zAxis);
  local_70.m_basis.m_el[0].m_floats[0] = bVar4.m_floats[0];
  local_70.m_basis.m_el[1].m_floats[0] = bVar4.m_floats[1];
  local_70.m_basis.m_el[0].m_floats[1] = yAxis.m_floats[0];
  local_70.m_basis.m_el[0].m_floats[2] = zAxis.m_floats[0];
  local_70.m_basis.m_el[0].m_floats[3] = 0.0;
  local_70.m_basis.m_el[1].m_floats[1] = yAxis.m_floats[1];
  local_70.m_basis.m_el[1].m_floats[2] = zAxis.m_floats[1];
  local_70.m_basis.m_el[1].m_floats[3] = 0.0;
  local_70.m_basis.m_el[2].m_floats[0] = bVar4.m_floats[2];
  local_70.m_basis.m_el[2].m_floats[1] = yAxis.m_floats[2];
  local_70.m_basis.m_el[2].m_floats[2] = zAxis.m_floats[2];
  local_70.m_basis.m_el[2].m_floats[3] = 0.0;
  local_70.m_origin.m_floats._0_8_ = *(undefined8 *)anchor->m_floats;
  local_70.m_origin.m_floats._8_8_ = *(undefined8 *)(anchor->m_floats + 2);
  btTransform::inverse(&local_b0,&(rbA->super_btCollisionObject).m_worldTransform);
  btTransform::operator*(&local_118,&local_b0,&local_70);
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats =
       local_118.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats + 2) =
       local_118.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats =
       local_118.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats + 2) =
       local_118.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats =
       local_118.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats + 2) =
       local_118.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInA.m_origin.m_floats =
       local_118.m_origin.m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInA.m_origin.m_floats + 2) =
       local_118.m_origin.m_floats._8_8_;
  btTransform::inverse(&local_b0,&(rbB->super_btCollisionObject).m_worldTransform);
  btTransform::operator*(&local_118,&local_b0,&local_70);
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats =
       local_118.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats + 2) =
       local_118.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats =
       local_118.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats + 2) =
       local_118.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats =
       local_118.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats + 2) =
       local_118.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->super_btGeneric6DofConstraint).m_frameInB.m_origin.m_floats =
       local_118.m_origin.m_floats._0_8_;
  *(undefined8 *)((this->super_btGeneric6DofConstraint).m_frameInB.m_origin.m_floats + 2) =
       local_118.m_origin.m_floats._8_8_;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_upperLimit.m_floats[0] = 0.0;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_upperLimit.m_floats[1] = 0.0;
  pbVar2 = &(this->super_btGeneric6DofConstraint).m_linearLimits;
  (pbVar2->m_upperLimit).m_floats[2] = 0.0;
  (pbVar2->m_upperLimit).m_floats[3] = 0.0;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_lowerLimit.m_floats[0] = 0.0;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_lowerLimit.m_floats[1] = 0.0;
  pbVar2 = &(this->super_btGeneric6DofConstraint).m_linearLimits;
  (pbVar2->m_lowerLimit).m_floats[2] = 0.0;
  (pbVar2->m_lowerLimit).m_floats[3] = 0.0;
  local_118.m_basis.m_el[0].m_floats[0] = 0.0;
  local_118.m_basis.m_el[0].m_floats[1] = -1.5607964;
  local_118.m_basis.m_el[0].m_floats[2] = -3.1315928;
  local_118.m_basis.m_el[0].m_floats[3] = 0.0;
  btGeneric6DofConstraint::setAngularLowerLimit
            (&this->super_btGeneric6DofConstraint,(btVector3 *)&local_118);
  local_118.m_basis.m_el[0].m_floats[0] = 0.0;
  local_118.m_basis.m_el[0].m_floats[1] = 1.5607964;
  local_118.m_basis.m_el[0].m_floats[2] = 3.1315928;
  local_118.m_basis.m_el[0].m_floats[3] = 0.0;
  btGeneric6DofConstraint::setAngularUpperLimit
            (&this->super_btGeneric6DofConstraint,(btVector3 *)&local_118);
  return;
}

Assistant:

btUniversalConstraint::btUniversalConstraint(btRigidBody& rbA, btRigidBody& rbB, const btVector3& anchor, const btVector3& axis1, const btVector3& axis2)
: btGeneric6DofConstraint(rbA, rbB, btTransform::getIdentity(), btTransform::getIdentity(), true),
 m_anchor(anchor),
 m_axis1(axis1),
 m_axis2(axis2)
{
	// build frame basis
	// 6DOF constraint uses Euler angles and to define limits
	// it is assumed that rotational order is :
	// Z - first, allowed limits are (-PI,PI);
	// new position of Y - second (allowed limits are (-PI/2 + epsilon, PI/2 - epsilon), where epsilon is a small positive number 
	// used to prevent constraint from instability on poles;
	// new position of X, allowed limits are (-PI,PI);
	// So to simulate ODE Universal joint we should use parent axis as Z, child axis as Y and limit all other DOFs
	// Build the frame in world coordinate system first
	btVector3 zAxis = m_axis1.normalize();
	btVector3 yAxis = m_axis2.normalize();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system
	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue(	xAxis[0], yAxis[0], zAxis[0],	
									xAxis[1], yAxis[1], zAxis[1],
									xAxis[2], yAxis[2], zAxis[2]);
	frameInW.setOrigin(anchor);
	// now get constraint frame in local coordinate systems
	m_frameInA = rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = rbB.getCenterOfMassTransform().inverse() * frameInW;
	// sei limits
	setLinearLowerLimit(btVector3(0., 0., 0.));
	setLinearUpperLimit(btVector3(0., 0., 0.));
	setAngularLowerLimit(btVector3(0.f, -SIMD_HALF_PI + UNIV_EPS, -SIMD_PI + UNIV_EPS));
	setAngularUpperLimit(btVector3(0.f,  SIMD_HALF_PI - UNIV_EPS,  SIMD_PI - UNIV_EPS));
}